

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_initCDict_internal
                 (ZSTD_CDict *cdict,void *dictBuffer,size_t dictSize,
                 ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType,
                 ZSTD_CCtx_params params)

{
  ZSTD_compressionParameters cParams;
  undefined1 auVar1 [20];
  uint uVar2;
  size_t sVar3;
  void *__dest;
  U32 *pUVar4;
  undefined4 in_stack_ffffffffffffff74;
  ZSTD_strategy in_stack_ffffffffffffff78;
  size_t err_code_1;
  size_t dictID;
  size_t err_code;
  void *internalBuffer;
  ZSTD_dictContentType_e dictContentType_local;
  ZSTD_dictLoadMethod_e dictLoadMethod_local;
  size_t dictSize_local;
  void *dictBuffer_local;
  ZSTD_CDict *cdict_local;
  
  auVar1 = params.cParams._8_20_;
  cParams.targetLength = in_stack_ffffffffffffff74;
  cParams.windowLog = auVar1._0_4_;
  cParams.chainLog = auVar1._4_4_;
  cParams.hashLog = auVar1._8_4_;
  cParams.searchLog = auVar1._12_4_;
  cParams.minMatch = auVar1._16_4_;
  cParams.strategy = in_stack_ffffffffffffff78;
  sVar3 = ZSTD_checkCParams(cParams);
  if (sVar3 != 0) {
    __assert_fail("!ZSTD_checkCParams(params.cParams)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x14c9,
                  "size_t ZSTD_initCDict_internal(ZSTD_CDict *, const void *, size_t, ZSTD_dictLoadMethod_e, ZSTD_dictContentType_e, ZSTD_CCtx_params)"
                 );
  }
  (cdict->matchState).cParams.windowLog = params.cParams.windowLog;
  (cdict->matchState).cParams.chainLog = params.cParams.chainLog;
  (cdict->matchState).cParams.hashLog = params.cParams.hashLog;
  (cdict->matchState).cParams.searchLog = params.cParams.searchLog;
  (cdict->matchState).cParams.minMatch = params.cParams.minMatch;
  (cdict->matchState).cParams.targetLength = params.cParams.targetLength;
  (cdict->matchState).cParams.strategy = params.cParams.strategy;
  (cdict->matchState).dedicatedDictSearch = params.enableDedicatedDictSearch;
  if (((dictLoadMethod == ZSTD_dlm_byRef) || (dictBuffer == (void *)0x0)) || (dictSize == 0)) {
    cdict->dictContent = dictBuffer;
  }
  else {
    sVar3 = ZSTD_cwksp_align(dictSize,8);
    __dest = ZSTD_cwksp_reserve_object(&cdict->workspace,sVar3);
    if (__dest == (void *)0x0) {
      return 0xffffffffffffffc0;
    }
    cdict->dictContent = __dest;
    memcpy(__dest,dictBuffer,dictSize);
  }
  cdict->dictContentSize = dictSize;
  cdict->dictContentType = dictContentType;
  pUVar4 = (U32 *)ZSTD_cwksp_reserve_object(&cdict->workspace,0x2200);
  cdict->entropyWorkspace = pUVar4;
  ZSTD_reset_compressedBlockState(&cdict->cBlockState);
  cdict_local = (ZSTD_CDict *)
                ZSTD_reset_matchState
                          (&cdict->matchState,&cdict->workspace,&params.cParams,
                           params.useRowMatchFinder,ZSTDcrp_makeClean,ZSTDirp_reset,
                           ZSTD_resetTarget_CDict);
  uVar2 = ERR_isError((size_t)cdict_local);
  if (uVar2 == 0) {
    params.fParams.contentSizeFlag = 1;
    cdict_local = (ZSTD_CDict *)
                  ZSTD_compress_insertDictionary
                            (&cdict->cBlockState,&cdict->matchState,(ldmState_t *)0x0,
                             &cdict->workspace,&params,cdict->dictContent,cdict->dictContentSize,
                             dictContentType,ZSTD_dtlm_full,ZSTD_tfp_forCDict,
                             cdict->entropyWorkspace);
    uVar2 = ERR_isError((size_t)cdict_local);
    if (uVar2 == 0) {
      if ((ZSTD_CDict *)0xffffffff < cdict_local) {
        __assert_fail("dictID <= (size_t)(U32)-1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x14ee,
                      "size_t ZSTD_initCDict_internal(ZSTD_CDict *, const void *, size_t, ZSTD_dictLoadMethod_e, ZSTD_dictContentType_e, ZSTD_CCtx_params)"
                     );
      }
      cdict->dictID = (U32)cdict_local;
      cdict_local = (ZSTD_CDict *)0x0;
    }
  }
  return (size_t)cdict_local;
}

Assistant:

static size_t ZSTD_initCDict_internal(
                    ZSTD_CDict* cdict,
              const void* dictBuffer, size_t dictSize,
                    ZSTD_dictLoadMethod_e dictLoadMethod,
                    ZSTD_dictContentType_e dictContentType,
                    ZSTD_CCtx_params params)
{
    DEBUGLOG(3, "ZSTD_initCDict_internal (dictContentType:%u)", (unsigned)dictContentType);
    assert(!ZSTD_checkCParams(params.cParams));
    cdict->matchState.cParams = params.cParams;
    cdict->matchState.dedicatedDictSearch = params.enableDedicatedDictSearch;
    if ((dictLoadMethod == ZSTD_dlm_byRef) || (!dictBuffer) || (!dictSize)) {
        cdict->dictContent = dictBuffer;
    } else {
         void *internalBuffer = ZSTD_cwksp_reserve_object(&cdict->workspace, ZSTD_cwksp_align(dictSize, sizeof(void*)));
        RETURN_ERROR_IF(!internalBuffer, memory_allocation, "NULL pointer!");
        cdict->dictContent = internalBuffer;
        ZSTD_memcpy(internalBuffer, dictBuffer, dictSize);
    }
    cdict->dictContentSize = dictSize;
    cdict->dictContentType = dictContentType;

    cdict->entropyWorkspace = (U32*)ZSTD_cwksp_reserve_object(&cdict->workspace, HUF_WORKSPACE_SIZE);


    /* Reset the state to no dictionary */
    ZSTD_reset_compressedBlockState(&cdict->cBlockState);
    FORWARD_IF_ERROR(ZSTD_reset_matchState(
        &cdict->matchState,
        &cdict->workspace,
        &params.cParams,
        params.useRowMatchFinder,
        ZSTDcrp_makeClean,
        ZSTDirp_reset,
        ZSTD_resetTarget_CDict), "");
    /* (Maybe) load the dictionary
     * Skips loading the dictionary if it is < 8 bytes.
     */
    {   params.compressionLevel = ZSTD_CLEVEL_DEFAULT;
        params.fParams.contentSizeFlag = 1;
        {   size_t const dictID = ZSTD_compress_insertDictionary(
                    &cdict->cBlockState, &cdict->matchState, NULL, &cdict->workspace,
                    &params, cdict->dictContent, cdict->dictContentSize,
                    dictContentType, ZSTD_dtlm_full, ZSTD_tfp_forCDict, cdict->entropyWorkspace);
            FORWARD_IF_ERROR(dictID, "ZSTD_compress_insertDictionary failed");
            assert(dictID <= (size_t)(U32)-1);
            cdict->dictID = (U32)dictID;
        }
    }

    return 0;
}